

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O1

hrgls_Status __thiscall hrgls::API::GetStatus(API *this)

{
  API_private *pAVar1;
  pthread_t pVar2;
  mapped_type *pmVar3;
  hrgls_Status hVar4;
  key_type local_30;
  
  pAVar1 = this->m_private;
  if (pAVar1 == (API_private *)0x0) {
    hVar4 = 0x3ee;
  }
  else {
    pVar2 = pthread_self();
    local_30._M_thread = pVar2;
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pAVar1->status,&local_30);
    hVar4 = *pmVar3;
    local_30._M_thread = pVar2;
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&this->m_private->status,&local_30);
    *pmVar3 = 0;
  }
  return hVar4;
}

Assistant:

hrgls_Status API::GetStatus()
  {
    if (!m_private) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    } else {
      hrgls_Status ret = m_private->status[std::this_thread::get_id()];
      m_private->status[std::this_thread::get_id()] = hrgls_STATUS_OKAY;
      return ret;
    }
  }